

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__horizontal_gather_7_channels_with_6_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float *pfVar54;
  long lVar55;
  float fVar56;
  float fVar57;
  
  pfVar1 = output_buffer + output_sub_size * 7;
  pfVar54 = horizontal_coefficients + 4;
  do {
    lVar55 = (long)horizontal_contributors->n0;
    fVar8 = pfVar54[-4];
    fVar9 = pfVar54[-3];
    fVar10 = pfVar54[-2];
    fVar11 = pfVar54[-1];
    pfVar2 = decode_buffer + lVar55 * 7;
    fVar12 = *pfVar2;
    fVar13 = pfVar2[1];
    fVar14 = pfVar2[2];
    fVar15 = pfVar2[3];
    pfVar2 = decode_buffer + lVar55 * 7 + 3;
    fVar16 = pfVar2[1];
    fVar17 = pfVar2[2];
    fVar18 = pfVar2[3];
    pfVar3 = decode_buffer + lVar55 * 7 + 7;
    fVar19 = *pfVar3;
    fVar20 = pfVar3[1];
    fVar21 = pfVar3[2];
    fVar22 = pfVar3[3];
    pfVar3 = decode_buffer + lVar55 * 7 + 10;
    fVar23 = pfVar3[1];
    fVar24 = pfVar3[2];
    fVar25 = pfVar3[3];
    pfVar4 = decode_buffer + lVar55 * 7 + 0xe;
    fVar26 = *pfVar4;
    fVar27 = pfVar4[1];
    fVar28 = pfVar4[2];
    fVar29 = pfVar4[3];
    pfVar4 = decode_buffer + lVar55 * 7 + 0x11;
    fVar30 = pfVar4[1];
    fVar31 = pfVar4[2];
    fVar32 = pfVar4[3];
    pfVar5 = decode_buffer + lVar55 * 7 + 0x15;
    fVar33 = *pfVar5;
    fVar34 = pfVar5[1];
    fVar35 = pfVar5[2];
    fVar36 = pfVar5[3];
    pfVar5 = decode_buffer + lVar55 * 7 + 0x18;
    fVar37 = pfVar5[1];
    fVar38 = pfVar5[2];
    fVar39 = pfVar5[3];
    fVar56 = (float)*(undefined8 *)pfVar54;
    fVar57 = (float)((ulong)*(undefined8 *)pfVar54 >> 0x20);
    pfVar6 = decode_buffer + lVar55 * 7 + 0x1c;
    fVar40 = *pfVar6;
    fVar41 = pfVar6[1];
    fVar42 = pfVar6[2];
    fVar43 = pfVar6[3];
    pfVar6 = decode_buffer + lVar55 * 7 + 0x1f;
    fVar44 = pfVar6[1];
    fVar45 = pfVar6[2];
    fVar46 = pfVar6[3];
    pfVar7 = decode_buffer + lVar55 * 7 + 0x23;
    fVar47 = *pfVar7;
    fVar48 = pfVar7[1];
    fVar49 = pfVar7[2];
    fVar50 = pfVar7[3];
    pfVar7 = decode_buffer + lVar55 * 7 + 0x26;
    fVar51 = pfVar7[1];
    fVar52 = pfVar7[2];
    fVar53 = pfVar7[3];
    output_buffer[3] =
         *pfVar7 * fVar57 + *pfVar5 * fVar11 + fVar9 * *pfVar3 +
         *pfVar6 * fVar56 + *pfVar4 * fVar10 + *pfVar2 * fVar8;
    output_buffer[4] =
         fVar51 * fVar57 + fVar37 * fVar11 + fVar9 * fVar23 +
         fVar44 * fVar56 + fVar30 * fVar10 + fVar16 * fVar8;
    output_buffer[5] =
         fVar52 * fVar57 + fVar38 * fVar11 + fVar9 * fVar24 +
         fVar45 * fVar56 + fVar31 * fVar10 + fVar17 * fVar8;
    output_buffer[6] =
         fVar53 * fVar57 + fVar39 * fVar11 + fVar9 * fVar25 +
         fVar46 * fVar56 + fVar32 * fVar10 + fVar18 * fVar8;
    *output_buffer =
         fVar47 * fVar57 + fVar33 * fVar11 + fVar19 * fVar9 +
         fVar40 * fVar56 + fVar26 * fVar10 + fVar12 * fVar8;
    output_buffer[1] =
         fVar48 * fVar57 + fVar34 * fVar11 + fVar20 * fVar9 +
         fVar41 * fVar56 + fVar27 * fVar10 + fVar13 * fVar8;
    output_buffer[2] =
         fVar49 * fVar57 + fVar35 * fVar11 + fVar21 * fVar9 +
         fVar42 * fVar56 + fVar28 * fVar10 + fVar14 * fVar8;
    output_buffer[3] =
         fVar50 * fVar57 + fVar36 * fVar11 + fVar22 * fVar9 +
         fVar43 * fVar56 + fVar29 * fVar10 + fVar15 * fVar8;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 7;
    pfVar54 = pfVar54 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_6_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__2_coeff_remnant(4);
    stbir__store_output();
  } while ( output < output_end );
}